

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_node_set * __thiscall
pugi::xpath_query::evaluate_node_set
          (xpath_node_set *__return_storage_ptr__,xpath_query *this,xpath_node *n)

{
  xpath_ast_node *this_00;
  undefined8 *puVar1;
  xpath_node_set_raw r;
  xpath_context c;
  xpath_stack_data sd;
  xpath_node_set_raw local_20b8;
  xpath_context local_2098;
  xpath_stack_data local_2078;
  
  this_00 = impl::anon_unknown_0::evaluate_node_set_prepare((xpath_query_impl *)this->_impl);
  if (this_00 == (xpath_ast_node *)0x0) {
    __return_storage_ptr__->_type = type_unsorted;
    __return_storage_ptr__->_storage[0]._node._root = (xml_node_struct *)0x0;
    __return_storage_ptr__->_storage[0]._attribute._attr = (xml_attribute_struct *)0x0;
    __return_storage_ptr__->_begin = __return_storage_ptr__->_storage;
    __return_storage_ptr__->_end = __return_storage_ptr__->_storage;
  }
  else {
    local_2098.n._node._root = (n->_node)._root;
    local_2098.n._attribute._attr = (n->_attribute)._attr;
    local_2098.position = 1;
    local_2098.size = 1;
    local_2078.stack.result = &local_2078.result;
    local_2078.result._error = &local_2078.oom;
    local_2078.result._root = local_2078.blocks;
    local_2078.result._root_size = 0;
    local_2078.stack.temp = &local_2078.temp;
    local_2078.temp._root = local_2078.blocks + 1;
    local_2078.temp._root_size = 0;
    local_2078.oom = false;
    local_2078.blocks[1].next = (xpath_memory_block *)0x0;
    local_2078.blocks[0].next = (xpath_memory_block *)0x0;
    local_2078.blocks[1].capacity = 0x1000;
    local_2078.blocks[0].capacity = 0x1000;
    local_2078.temp._error = local_2078.result._error;
    impl::anon_unknown_0::xpath_ast_node::eval_node_set
              (&local_20b8,this_00,&local_2098,&local_2078.stack,nodeset_eval_all);
    if (local_2078.oom == true) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = std::ostream::_M_insert<long>;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    __return_storage_ptr__->_type = type_unsorted;
    __return_storage_ptr__->_storage[0]._node._root = (xml_node_struct *)0x0;
    __return_storage_ptr__->_storage[0]._attribute._attr = (xml_attribute_struct *)0x0;
    __return_storage_ptr__->_begin = __return_storage_ptr__->_storage;
    __return_storage_ptr__->_end = __return_storage_ptr__->_storage;
    xpath_node_set::_assign
              (__return_storage_ptr__,local_20b8._begin,local_20b8._end,local_20b8._type);
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(&local_2078);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xpath_node_set xpath_query::evaluate_node_set(const xpath_node& n) const
	{
		impl::xpath_ast_node* root = impl::evaluate_node_set_prepare(static_cast<impl::xpath_query_impl*>(_impl));
		if (!root) return xpath_node_set();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_node_set_raw r = root->eval_node_set(c, sd.stack, impl::nodeset_eval_all);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return xpath_node_set();
		#else
			throw std::bad_alloc();
		#endif
		}

		return xpath_node_set(r.begin(), r.end(), r.type());
	}